

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O0

void idx2::Init(encode_data *E,allocator *Alloc)

{
  allocator *paVar1;
  mallocator *pmVar2;
  allocator *local_80;
  allocator *Alloc_local;
  encode_data *E_local;
  
  paVar1 = &Mallocator()->super_allocator;
  Init<unsigned_long,idx2::brick_volume>(&E->BrickPool,9,paVar1);
  paVar1 = &Mallocator()->super_allocator;
  Init<unsigned_int,idx2::channel>(&E->Channels,10,paVar1);
  paVar1 = &Mallocator()->super_allocator;
  Init<unsigned_long,idx2::sub_channel>(&E->SubChannels,5,paVar1);
  local_80 = Alloc;
  if (Alloc == (allocator *)0x0) {
    local_80 = (allocator *)BrickAlloc_;
  }
  E->Alloc = local_80;
  paVar1 = &Mallocator()->super_allocator;
  Init<unsigned_long,idx2::chunk_meta_info>(&E->ChunkMeta,8,paVar1);
  paVar1 = &Mallocator()->super_allocator;
  Init<unsigned_long,idx2::chunk_exp_info>(&E->ChunkExponents,5,paVar1);
  pmVar2 = Mallocator();
  (**(pmVar2->super_allocator)._vptr_allocator)(pmVar2,&E->CompressedChunkAddresses,0x4008);
  (E->CompressedChunkAddresses).BitPtr = (E->CompressedChunkAddresses).Stream.Data;
  (E->CompressedChunkAddresses).BitPos = 0;
  (E->CompressedChunkAddresses).BitBuf = 0;
  pmVar2 = Mallocator();
  (**(pmVar2->super_allocator)._vptr_allocator)(pmVar2,&E->ChunkStream,0x4008);
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  pmVar2 = Mallocator();
  (**(pmVar2->super_allocator)._vptr_allocator)(pmVar2,&E->ChunkExpStream,0x8008);
  (E->ChunkExpStream).BitPtr = (E->ChunkExpStream).Stream.Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  return;
}

Assistant:

void
Init(encode_data* E, allocator* Alloc)
{
  Init(&E->BrickPool, 9);
  Init(&E->Channels, 10);
  Init(&E->SubChannels, 5);
  E->Alloc = Alloc ? Alloc : &BrickAlloc_;
  Init(&E->ChunkMeta, 8);
  Init(&E->ChunkExponents, 5);
  //InitWrite(&E->CompressedExps, 32768);
  InitWrite(&E->CompressedChunkAddresses, 16384);
  InitWrite(&E->ChunkStream, 16384);
  InitWrite(&E->ChunkExpStream, 32768);
}